

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib500.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  CURL *curl;
  FILE *__stream;
  curl_off_t time_starttransfer;
  curl_off_t time_pretransfer;
  char *ipstr;
  curl_off_t time_total;
  curl_off_t time_connect;
  curl_off_t time_namelookup;
  long local_58;
  long local_50;
  undefined8 local_48;
  long local_40;
  long local_38;
  long local_30;
  
  local_48 = 0;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    curl = (CURL *)curl_easy_init();
    if (curl != (CURL *)0x0) {
      iVar1 = curl_easy_setopt(curl,0x2712,URL);
      if ((iVar1 == 0) && (iVar1 = curl_easy_setopt(curl,0x2a,1), iVar1 == 0)) {
        libtest_debug_config.tracetime = 1;
        libtest_debug_config.nohex = 1;
        iVar1 = curl_easy_setopt(curl,0x276f);
        if (((iVar1 == 0) &&
            ((iVar1 = curl_easy_setopt(curl,0x4e7e,libtest_debug_cb), iVar1 == 0 &&
             (iVar1 = curl_easy_setopt(curl,0x29,1), iVar1 == 0)))) &&
           ((libtest_arg3 == (char *)0x0 ||
            ((iVar1 = strcmp(libtest_arg3,"activeftp"), iVar1 != 0 ||
             (iVar1 = curl_easy_setopt(curl,0x2721,"-"), iVar1 == 0)))))) {
          setupcallbacks(curl);
          iVar1 = curl_easy_perform(curl);
          if ((iVar1 == 0) &&
             ((iVar1 = curl_easy_getinfo(curl,0x100020,&local_48), libtest_arg2 != (char *)0x0 &&
              (__stream = fopen64(libtest_arg2,"wb"), __stream != (FILE *)0x0)))) {
            curl_mfprintf(__stream,"IP: %s\n",local_48);
            curl_easy_getinfo(curl,0x600033,&local_30);
            curl_easy_getinfo(curl,0x600034,&local_38);
            curl_easy_getinfo(curl,0x600035,&local_50);
            curl_easy_getinfo(curl,0x600036,&local_58);
            curl_easy_getinfo(curl,0x600032,&local_40);
            if (local_38 < local_30) {
              curl_mfprintf(__stream,"namelookup vs connect: %ld.%06ld %ld.%06ld\n",
                            local_30 / 1000000,local_30 % 1000000,local_38 / 1000000,
                            local_38 % 1000000);
            }
            if (local_50 < local_38) {
              curl_mfprintf(__stream,"connect vs pretransfer: %ld.%06ld %ld.%06ld\n",
                            local_38 / 1000000,local_38 % 1000000,local_50 / 1000000,
                            local_50 % 1000000);
            }
            if (local_58 < local_50) {
              curl_mfprintf(__stream,"pretransfer vs starttransfer: %ld.%06ld %ld.%06ld\n",
                            local_50 / 1000000,local_50 % 1000000,local_58 / 1000000,
                            local_58 % 1000000);
            }
            if (local_40 < local_58) {
              curl_mfprintf(__stream,"starttransfer vs total: %ld.%06ld %ld.%06ld\n",
                            local_58 / 1000000,local_58 % 1000000,local_40 / 1000000,
                            local_40 % 1000000);
            }
            fclose(__stream);
          }
        }
      }
      curl_easy_cleanup(curl);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;
  char *ipstr = NULL;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_HEADER, 1L);

  libtest_debug_config.nohex = 1;
  libtest_debug_config.tracetime = 1;
  test_setopt(curl, CURLOPT_DEBUGDATA, &libtest_debug_config);
  test_setopt(curl, CURLOPT_DEBUGFUNCTION, libtest_debug_cb);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  if(libtest_arg3 && !strcmp(libtest_arg3, "activeftp"))
    test_setopt(curl, CURLOPT_FTPPORT, "-");

  setupcallbacks(curl);

  res = curl_easy_perform(curl);

  if(!res) {
    res = curl_easy_getinfo(curl, CURLINFO_PRIMARY_IP, &ipstr);
    if(libtest_arg2) {
      FILE *moo = fopen(libtest_arg2, "wb");
      if(moo) {
        curl_off_t time_namelookup;
        curl_off_t time_connect;
        curl_off_t time_pretransfer;
        curl_off_t time_starttransfer;
        curl_off_t time_total;
        fprintf(moo, "IP: %s\n", ipstr);
        curl_easy_getinfo(curl, CURLINFO_NAMELOOKUP_TIME_T, &time_namelookup);
        curl_easy_getinfo(curl, CURLINFO_CONNECT_TIME_T, &time_connect);
        curl_easy_getinfo(curl, CURLINFO_PRETRANSFER_TIME_T,
                          &time_pretransfer);
        curl_easy_getinfo(curl, CURLINFO_STARTTRANSFER_TIME_T,
                          &time_starttransfer);
        curl_easy_getinfo(curl, CURLINFO_TOTAL_TIME_T, &time_total);

        /* since the timing will always vary we only compare relative
           differences between these 5 times */
        if(time_namelookup > time_connect) {
          fprintf(moo, "namelookup vs connect: %" CURL_FORMAT_CURL_OFF_T
                  ".%06ld %" CURL_FORMAT_CURL_OFF_T ".%06ld\n",
                  (time_namelookup / 1000000),
                  (long)(time_namelookup % 1000000),
                  (time_connect / 1000000), (long)(time_connect % 1000000));
        }
        if(time_connect > time_pretransfer) {
          fprintf(moo, "connect vs pretransfer: %" CURL_FORMAT_CURL_OFF_T
                  ".%06ld %" CURL_FORMAT_CURL_OFF_T ".%06ld\n",
                  (time_connect / 1000000), (long)(time_connect % 1000000),
                  (time_pretransfer / 1000000),
                  (long)(time_pretransfer % 1000000));
        }
        if(time_pretransfer > time_starttransfer) {
          fprintf(moo, "pretransfer vs starttransfer: %" CURL_FORMAT_CURL_OFF_T
                  ".%06ld %" CURL_FORMAT_CURL_OFF_T ".%06ld\n",
                  (time_pretransfer / 1000000),
                  (long)(time_pretransfer % 1000000),
                  (time_starttransfer / 1000000),
                  (long)(time_starttransfer % 1000000));
        }
        if(time_starttransfer > time_total) {
          fprintf(moo, "starttransfer vs total: %" CURL_FORMAT_CURL_OFF_T
                  ".%06ld %" CURL_FORMAT_CURL_OFF_T ".%06ld\n",
                  (time_starttransfer / 1000000),
                  (long)(time_starttransfer % 1000000),
                  (time_total / 1000000), (long)(time_total % 1000000));
        }

        fclose(moo);
      }
    }
  }

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}